

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Data *pDVar1;
  int *piVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Data *pDVar9;
  Data *pDVar10;
  undefined1 auVar11 [8];
  bool bVar12;
  char cVar13;
  int iVar14;
  QString *data;
  long lVar15;
  storage_type *psVar16;
  iterator iVar17;
  undefined8 *puVar18;
  iterator iVar19;
  iterator iVar20;
  iterator iVar21;
  pointer pQVar22;
  long *plVar23;
  QArrayData *pQVar24;
  iterator args;
  iterator iVar25;
  undefined4 uVar26;
  ulong uVar27;
  ulong uVar28;
  QString *pQVar29;
  QString *pQVar30;
  QByteArray *line;
  int iVar31;
  QStringBuilder<QString_&,_QLatin1String> *pQVar32;
  QHash<QString,_QString> QVar33;
  QString *var;
  long lVar34;
  long in_FS_OFFSET;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QLatin1String QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QAnyStringView QVar51;
  QAnyStringView QVar52;
  QStringView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QLatin1String QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QStringView QVar68;
  QStringView QVar69;
  QLatin1String QVar70;
  QLatin1String QVar71;
  QAnyStringView QVar72;
  QLatin1String QVar73;
  QAnyStringView QVar74;
  QAnyStringView QVar75;
  QAnyStringView QVar76;
  QAnyStringView QVar77;
  QLatin1String QVar78;
  QLatin1String QVar79;
  QAnyStringView QVar80;
  QByteArrayView QVar81;
  QAnyStringView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QByteArrayView QVar87;
  QByteArrayView QVar88;
  QByteArrayView QVar89;
  QByteArrayView QVar90;
  QByteArrayView QVar91;
  QByteArrayView QVar92;
  QByteArrayView QVar93;
  QByteArrayView QVar94;
  QAnyStringView QVar95;
  QByteArrayView QVar96;
  QAnyStringView QVar97;
  QByteArrayView QVar98;
  QAnyStringView QVar99;
  QByteArrayView QVar100;
  QAnyStringView QVar101;
  QAnyStringView QVar102;
  QStringView QVar103;
  QByteArrayView QVar104;
  QStringView QVar105;
  QLatin1String QVar106;
  QLatin1String QVar107;
  QLatin1String QVar108;
  QLatin1String QVar109;
  QStringView QVar110;
  undefined1 auVar111 [16];
  QRegularExpressionMatch match_1;
  QRegularExpression newLoggingFormat;
  QRegularExpression oldFormats;
  int exitCode;
  QXmlStreamReader reader;
  QRegularExpressionMatch match;
  QArrayData *d_1;
  QArrayDataPointer<QString> local_318;
  QByteArray local_2f8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  int local_2c4;
  QArrayData *local_2c0 [3];
  QArrayDataPointer<QString> local_2a8;
  QStringBuilder<QString_&,_QLatin1String> local_288;
  QString local_270;
  QString local_258;
  QString local_240;
  QArrayDataPointer<QString> local_228;
  QString local_208;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [4];
  QFlagsStorage<QArrayData::ArrayOption> QStack_1d4;
  QChar QStack_1d0;
  undefined2 uStack_1ce;
  undefined4 uStack_1cc;
  undefined8 local_1c8;
  QString local_1c0;
  QArrayData *local_1a8;
  QString *pQStack_1a0;
  storage_type *local_198;
  QArrayData *local_190;
  QString *pQStack_188;
  storage_type *local_180;
  QArrayData *local_178;
  QString *local_170;
  storage_type *psStack_168;
  QArrayData *local_160;
  QString *pQStack_158;
  storage_type *local_150;
  QArrayData *local_148;
  QString *pQStack_140;
  storage_type *local_138;
  QArrayData *local_130;
  QString *local_128;
  storage_type *psStack_120;
  QArrayData *local_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [8];
  QArrayData *local_f8;
  undefined8 local_f0;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  QStringBuilder<QString_&,_QLatin1String> local_78;
  undefined1 local_58 [8];
  QString *pQStack_50;
  storage_type *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c4 = argc;
  signal(2,sigHandler);
  signal(0xf,sigHandler);
  local_2d8 = 0xaaaaaaaaaaaaaaaa;
  uStack_2d0 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_2d8,&local_2c4,argv,0x60a00);
  local_48 = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  pQStack_50 = (QString *)0xaaaaaaaaaaaaaaaa;
  QCoreApplication::arguments();
  iVar31 = 1;
  if ((storage_type *)0x1 < local_48) {
    iVar31 = 1;
    lVar15 = 1;
LAB_0010837b:
    pQVar30 = pQStack_50 + lVar15;
    QVar35.m_data = (char *)0x5;
    QVar35.m_size = (qsizetype)pQVar30;
    iVar14 = QString::compare(QVar35,0x1117d2);
    if (iVar14 == 0) {
      if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
        pQVar30 = pQStack_50 + (iVar31 + 1);
        pQVar29 = &g_options.adbCommand;
LAB_00108675:
        QString::operator=(pQVar29,(QString *)pQVar30);
LAB_0010867a:
        iVar31 = iVar31 + 1;
        goto LAB_0010867d;
      }
    }
    else {
      QVar36.m_data = (char *)0x6;
      QVar36.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar36,0x1117d8);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.buildPath;
          goto LAB_00108675;
        }
        goto LAB_0010864c;
      }
      QVar37.m_data = (char *)0xa;
      QVar37.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar37,0x1117df);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.manifestPath;
          goto LAB_00108675;
        }
        goto LAB_0010864c;
      }
      QVar38.m_data = (char *)0x6;
      QVar38.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar38,0x1117ea);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.makeCommand;
          goto LAB_00108675;
        }
        goto LAB_0010864c;
      }
      QVar39.m_data = (char *)0x5;
      QVar39.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar39,0x1117f1);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.apkPath;
          goto LAB_00108675;
        }
        goto LAB_0010864c;
      }
      QVar40.m_data = (char *)0xa;
      QVar40.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar40,0x1117f7);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.activity;
          goto LAB_00108675;
        }
        goto LAB_0010864c;
      }
      QVar41.m_data = (char *)0x13;
      QVar41.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar41,0x111802);
      if (iVar14 == 0) {
        g_options.skipAddInstallRoot = true;
        goto LAB_0010867d;
      }
      QVar42.m_data = (char *)0xd;
      QVar42.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar42,0x111816);
      if (iVar14 == 0) {
        g_options.showLogcatOutput = true;
        goto LAB_0010867d;
      }
      QVar43.m_data = (char *)0xb;
      QVar43.m_size = (qsizetype)pQVar30;
      iVar14 = QString::compare(QVar43,0x111824);
      if (iVar14 == 0) {
        if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
          pQVar30 = pQStack_50 + (iVar31 + 1);
          pQVar29 = &g_options.ndkStackPath;
          goto LAB_00108675;
        }
      }
      else {
        QVar44.m_data = (char *)0x9;
        QVar44.m_size = (qsizetype)pQVar30;
        iVar14 = QString::compare(QVar44,0x111830);
        if (iVar14 != 0) {
          QVar45.m_data = (char *)0x6;
          QVar45.m_size = (qsizetype)pQVar30;
          iVar14 = QString::compare(QVar45,0x11183a);
          if (iVar14 == 0) goto LAB_0010864c;
          QVar46.m_data = (char *)0x9;
          QVar46.m_size = (qsizetype)pQVar30;
          iVar14 = QString::compare(QVar46,0x111841);
          if (iVar14 != 0) {
            QVar47.m_data = (char *)0x16;
            QVar47.m_size = (qsizetype)pQVar30;
            iVar14 = QString::compare(QVar47,0x11184b);
            if (iVar14 == 0) {
              if (local_48 != (storage_type *)(long)(iVar31 + 1)) {
                QVar50.m_data = (storage_type_conflict *)pQStack_50[iVar31 + 1].d.size;
                QVar50.m_size = (qsizetype)local_1d8;
                QProcess::splitCommand(QVar50);
                QList<QList<QString>_>::operator+=
                          (&g_options.preTestRunAdbCommands,(rvalue_ref)local_1d8);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_1d8);
                goto LAB_0010867a;
              }
              goto LAB_0010864c;
            }
            QVar48.m_data = (char *)0x2;
            QVar48.m_size = (qsizetype)pQVar30;
            iVar14 = QString::compare(QVar48,0x111862);
            if (iVar14 != 0) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)&g_options.testArgsList,
                         g_options.testArgsList.d.size,pQStack_50 + lVar15);
              QList<QString>::end(&g_options.testArgsList);
              goto LAB_0010867d;
            }
            iVar31 = iVar31 + 1;
            goto LAB_0010877d;
          }
          g_options.verbose = true;
          goto LAB_0010867d;
        }
        psVar16 = (storage_type *)(long)(iVar31 + 1);
        if (local_48 != psVar16) {
          QVar49.m_data = pQStack_50[(long)psVar16].d.ptr;
          QVar49.m_size = pQStack_50[(long)psVar16].d.size;
          lVar15 = QString::toIntegral_helper(QVar49,(bool *)0x0,10);
          g_options.timeoutSecs = (int)lVar15;
          if (g_options.timeoutSecs != lVar15) {
            g_options.timeoutSecs = 0;
          }
          goto LAB_0010867a;
        }
      }
    }
LAB_0010864c:
    g_options.helpRequested = true;
LAB_0010867d:
    iVar31 = iVar31 + 1;
    lVar15 = (long)iVar31;
    if ((long)local_48 <= lVar15) goto LAB_0010877d;
    goto LAB_0010837b;
  }
LAB_0010877d:
  if (g_options.skipAddInstallRoot == false) {
    local_1c8._4_4_ = (uint)((ulong)g_options.makeCommand.d.size >> 0x20) | 0x80000000;
    local_98.d = (Data *)local_1d8;
    local_1d8[0] = (QProcessEnvironment)0x1;
    QStack_1d0.ucs = (char16_t)g_options.makeCommand.d.ptr;
    uStack_1ce = (undefined2)((ulong)g_options.makeCommand.d.ptr >> 0x10);
    uStack_1cc = (undefined4)((ulong)g_options.makeCommand.d.ptr >> 0x20);
    local_1c8._0_4_ = (undefined4)g_options.makeCommand.d.size;
    local_98.ptr = (QString *)0x0;
    QVar51.m_size = (size_t)"%1 INSTALL_ROOT=%2 install";
    QVar51.field_0.m_data = &local_78;
    QtPrivate::argToQString(QVar51,0x400000000000001a,(ArgBase **)0x1);
    QDir::toNativeSeparators((QString *)&local_98);
    QVar52.m_size = (size_t)&local_78;
    QVar52.field_0.m_data = local_1d8;
    QString::arg_impl(QVar52,(int)local_98.ptr,(QChar)(char16_t)local_98.size);
    pDVar9 = g_options.makeCommand.d.d;
    pDVar1 = (Data *)CONCAT44(QStack_1d4.i,
                              CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
    pcVar3 = (char16_t *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
    local_1d8[0] = SUB81(g_options.makeCommand.d.d,0);
    local_1d8[1] = (undefined1)((ulong)g_options.makeCommand.d.d >> 8);
    local_1d8._2_2_ = (undefined2)((ulong)g_options.makeCommand.d.d >> 0x10);
    QStack_1d4.i = (Int)((ulong)g_options.makeCommand.d.d >> 0x20);
    qVar4 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
    QStack_1d0.ucs = (char16_t)g_options.makeCommand.d.ptr;
    uStack_1ce = (undefined2)((ulong)g_options.makeCommand.d.ptr >> 0x10);
    uStack_1cc = (undefined4)((ulong)g_options.makeCommand.d.ptr >> 0x20);
    local_1c8._0_4_ = (undefined4)g_options.makeCommand.d.size;
    local_1c8._4_4_ = (uint)((ulong)g_options.makeCommand.d.size >> 0x20);
    g_options.makeCommand.d.ptr = pcVar3;
    g_options.makeCommand.d.size = qVar4;
    if (g_options.makeCommand.d.d != (Data *)0x0) {
      LOCK();
      pQVar5 = &(g_options.makeCommand.d.d)->super_QArrayData;
      pQVar24 = &(g_options.makeCommand.d.d)->super_QArrayData;
      g_options.makeCommand.d.d = pDVar1;
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pDVar1 = g_options.makeCommand.d.d;
      if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
        pDVar1 = g_options.makeCommand.d.d;
      }
    }
    g_options.makeCommand.d.d = pDVar1;
    pDVar10 = local_98.d;
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
      }
    }
  }
  lVar15 = (long)iVar31;
  if (lVar15 < (long)local_48) {
    lVar34 = lVar15 * 0x18;
    do {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&g_options.testArgsList,g_options.testArgsList.d.size,
                 (QString *)((long)&(pQStack_50->d).d + lVar34));
      QList<QString>::end(&g_options.testArgsList);
      lVar15 = lVar15 + 1;
      lVar34 = lVar34 + 0x18;
    } while (lVar15 < (long)local_48);
  }
  if (((g_options.helpRequested == false) && (g_options.buildPath.d.size != 0)) &&
     (g_options.apkPath.d.size != 0)) {
    qEnvironmentVariable(local_1d8);
    pDVar9 = g_options.serial.d.d;
    pDVar1 = (Data *)CONCAT44(QStack_1d4.i,
                              CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
    pcVar3 = (char16_t *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
    local_1d8[0] = SUB81(g_options.serial.d.d,0);
    local_1d8[1] = (undefined1)((ulong)g_options.serial.d.d >> 8);
    local_1d8._2_2_ = (undefined2)((ulong)g_options.serial.d.d >> 0x10);
    QStack_1d4.i = (Int)((ulong)g_options.serial.d.d >> 0x20);
    qVar4 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
    QStack_1d0.ucs = (char16_t)g_options.serial.d.ptr;
    uStack_1ce = (undefined2)((ulong)g_options.serial.d.ptr >> 0x10);
    uStack_1cc = (undefined4)((ulong)g_options.serial.d.ptr >> 0x20);
    local_1c8._0_4_ = (undefined4)g_options.serial.d.size;
    local_1c8._4_4_ = (uint)((ulong)g_options.serial.d.size >> 0x20);
    g_options.serial.d.ptr = pcVar3;
    g_options.serial.d.size = qVar4;
    if (g_options.serial.d.d != (Data *)0x0) {
      LOCK();
      pQVar5 = &(g_options.serial.d.d)->super_QArrayData;
      pQVar24 = &(g_options.serial.d.d)->super_QArrayData;
      g_options.serial.d.d = pDVar1;
      (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pDVar1 = g_options.serial.d.d;
      if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
        pDVar1 = g_options.serial.d.d;
      }
    }
    g_options.serial.d.d = pDVar1;
    pDVar1 = g_options.serial.d.d;
    if (g_options.serial.d.size == 0) {
      qEnvironmentVariable(local_1d8);
      pDVar9 = g_options.serial.d.d;
      pDVar1 = (Data *)CONCAT44(QStack_1d4.i,
                                CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
      pcVar3 = (char16_t *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
      local_1d8[0] = SUB81(g_options.serial.d.d,0);
      local_1d8[1] = (undefined1)((ulong)g_options.serial.d.d >> 8);
      local_1d8._2_2_ = (undefined2)((ulong)g_options.serial.d.d >> 0x10);
      QStack_1d4.i = (Int)((ulong)g_options.serial.d.d >> 0x20);
      qVar4 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
      QStack_1d0.ucs = (char16_t)g_options.serial.d.ptr;
      uStack_1ce = (undefined2)((ulong)g_options.serial.d.ptr >> 0x10);
      uStack_1cc = (undefined4)((ulong)g_options.serial.d.ptr >> 0x20);
      local_1c8._0_4_ = (undefined4)g_options.serial.d.size;
      local_1c8._4_4_ = (uint)((ulong)g_options.serial.d.size >> 0x20);
      g_options.serial.d.ptr = pcVar3;
      g_options.serial.d.size = qVar4;
      if (g_options.serial.d.d != (Data *)0x0) {
        LOCK();
        pQVar5 = &(g_options.serial.d.d)->super_QArrayData;
        pQVar24 = &(g_options.serial.d.d)->super_QArrayData;
        g_options.serial.d.d = pDVar1;
        (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pDVar1 = g_options.serial.d.d;
        if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
          pDVar1 = g_options.serial.d.d;
        }
      }
    }
    g_options.serial.d.d = pDVar1;
    if (g_options.ndkStackPath.d.size == 0) {
      local_78.b.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
      local_78.b.m_size = -0x5555555555555556;
      qEnvironmentVariable((char *)&local_78);
      local_98.size = -0x5555555555555556;
      local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_98.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_1d8[0] = SUB81(&local_78,0);
      local_1d8[1] = (undefined1)((ulong)&local_78 >> 8);
      local_1d8._2_2_ = (undefined2)((ulong)&local_78 >> 0x10);
      QStack_1d4.i = (Int)((ulong)&local_78 >> 0x20);
      QStack_1d0.ucs = L'/';
      local_1c8._0_4_ = 9;
      local_1c8._4_4_ = 0;
      local_1c0.d.d = (Data *)0x111826;
      QStringBuilder<QStringBuilder<const_QString_&,_QChar>,_QLatin1String>::convertTo<QString>
                ((QString *)&local_98,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QChar>,_QLatin1String> *)local_1d8)
      ;
      cVar13 = QFile::exists((QString *)&local_98);
      if (cVar13 != '\0') {
        QString::operator=(&g_options.ndkStackPath,(QString *)&local_98);
      }
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
        }
      }
    }
    pDVar1 = g_options.manifestPath.d.d;
    if (g_options.manifestPath.d.size == 0) {
      local_78.a = &g_options.buildPath;
      local_78.b.m_size = 0x14;
      local_78.b.m_data = "/AndroidManifest.xml";
      QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>((QString *)local_1d8,&local_78);
      pDVar9 = g_options.manifestPath.d.d;
      pDVar1 = (Data *)CONCAT44(QStack_1d4.i,
                                CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
      pcVar3 = (char16_t *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
      local_1d8[0] = SUB81(g_options.manifestPath.d.d,0);
      local_1d8[1] = (undefined1)((ulong)g_options.manifestPath.d.d >> 8);
      local_1d8._2_2_ = (undefined2)((ulong)g_options.manifestPath.d.d >> 0x10);
      QStack_1d4.i = (Int)((ulong)g_options.manifestPath.d.d >> 0x20);
      qVar4 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
      QStack_1d0.ucs = (char16_t)g_options.manifestPath.d.ptr;
      uStack_1ce = (undefined2)((ulong)g_options.manifestPath.d.ptr >> 0x10);
      uStack_1cc = (undefined4)((ulong)g_options.manifestPath.d.ptr >> 0x20);
      local_1c8._0_4_ = (undefined4)g_options.manifestPath.d.size;
      local_1c8._4_4_ = (uint)((ulong)g_options.manifestPath.d.size >> 0x20);
      g_options.manifestPath.d.ptr = pcVar3;
      g_options.manifestPath.d.size = qVar4;
      if (g_options.manifestPath.d.d != (Data *)0x0) {
        LOCK();
        pQVar5 = &(g_options.manifestPath.d.d)->super_QArrayData;
        pQVar24 = &(g_options.manifestPath.d.d)->super_QArrayData;
        g_options.manifestPath.d.d = pDVar1;
        (pQVar24->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pDVar1 = g_options.manifestPath.d.d;
        if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
          pDVar1 = g_options.manifestPath.d.d;
        }
      }
    }
    g_options.manifestPath.d.d = pDVar1;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
    if (g_options.makeCommand.d.size == 0) {
      main_cold_14();
      goto LAB_0010b4d9;
    }
    local_2f8.d.d = (Data *)0x0;
    local_2f8.d.ptr = (char *)0x0;
    local_2f8.d.size = 0;
    local_1c8._0_4_ = 0xaaaaaaaa;
    local_1c8._4_4_ = 0xaaaaaaaa;
    local_1d8[0] = (QProcessEnvironment)0xaa;
    local_1d8[1] = 0xaa;
    local_1d8._2_2_ = 0xaaaa;
    QStack_1d4.i = 0xaaaaaaaa;
    QStack_1d0.ucs = L'ꪪ';
    uStack_1ce = 0xaaaa;
    uStack_1cc = 0xaaaaaaaa;
    QVar53.m_data = (storage_type_conflict *)g_options.makeCommand.d.size;
    QVar53.m_size = (qsizetype)local_1d8;
    QProcess::splitCommand(QVar53);
    iVar17 = QList<QString>::begin((QList<QString> *)local_1d8);
    local_58 = (undefined1  [8])((iVar17.i)->d).d;
    pQStack_50 = (QString *)((iVar17.i)->d).ptr;
    local_48 = (storage_type *)((iVar17.i)->d).size;
    if (local_58 != (undefined1  [8])0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58)->ref_)->ref_)._q_value.super___atomic_base<int>._M_i
           = (((QArrayData *)&((QArrayData *)local_58)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPrivate::sequential_erase_one<QList<QString>,QString>
              ((QList<QString> *)local_1d8,(QString *)local_58);
    bVar12 = execCommand((QString *)local_58,(QList<QString> *)local_1d8,&local_2f8,true);
    if (local_58 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_1d8);
    if (bVar12) {
      cVar13 = QFile::exists((QString *)&g_options.apkPath);
      if (cVar13 == '\0') {
        main_cold_2();
        goto LAB_0010b4f4;
      }
      local_318.size = -0x5555555555555556;
      local_318.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_318.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_48 = (storage_type *)0x0;
      local_58 = (undefined1  [8])0x0;
      pQStack_50 = (QString *)0x0;
      QVar54.m_data = (storage_type *)0x7;
      QVar54.m_size = (qsizetype)local_1d8;
      QString::fromLatin1(QVar54);
      pQVar5 = (QArrayData *)
               CONCAT44(QStack_1d4.i,CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
      uVar7 = CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
      uVar8 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
      local_1d8[0] = (QProcessEnvironment)0xaa;
      local_1d8[1] = 0xaa;
      local_1d8._2_2_ = 0xaaaa;
      QStack_1d4.i = 0xaaaaaaaa;
      puVar18 = (undefined8 *)QArrayData::allocate((QArrayData **)local_1d8,0x18,0x10,1,KeepSize);
      QStack_1d0.ucs = (char16_t)puVar18;
      uStack_1ce = (undefined2)((ulong)puVar18 >> 0x10);
      uStack_1cc = (undefined4)((ulong)puVar18 >> 0x20);
      *puVar18 = pQVar5;
      puVar18[1] = uVar7;
      puVar18[2] = uVar8;
      if (pQVar5 == (QArrayData *)0x0) {
        local_1c8._0_4_ = 1;
        local_1c8._4_4_ = 0;
        execAdbCommand((QStringList *)local_1d8,(QByteArray *)local_58,false);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_1d8);
      }
      else {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_1c8 = 1;
        execAdbCommand((QStringList *)local_1d8,(QByteArray *)local_58,false);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_1d8);
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      local_318.d = (Data *)0x0;
      local_318.ptr = (QString *)0x0;
      local_318.size = 0;
      QByteArray::split((char)(QList<QByteArray> *)local_1d8);
      iVar19 = QList<QByteArray>::begin((QList<QByteArray> *)local_1d8);
      iVar20 = QList<QByteArray>::end((QList<QByteArray> *)local_1d8);
      if (iVar19.i != iVar20.i) {
        do {
          QVar55.m_data = ((iVar19.i)->d).ptr;
          QVar55.m_size = ((iVar19.i)->d).size;
          QVar104.m_data = "\tdevice";
          QVar104.m_size = 7;
          lVar15 = QtPrivate::findByteArray(QVar55,0,QVar104);
          if (lVar15 != -1) {
            QByteArray::split((char)&local_98);
            iVar21 = QList<QByteArray>::begin((QList<QByteArray> *)&local_98);
            QVar56.m_data = (storage_type *)((iVar21.i)->d).size;
            QVar56.m_size = (qsizetype)&local_78;
            QString::fromUtf8(QVar56);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&local_318,local_318.size,(QString *)&local_78);
            QList<QString>::end((QList<QString> *)&local_318);
            if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
              }
            }
            QArrayDataPointer<QByteArray>::~QArrayDataPointer
                      ((QArrayDataPointer<QByteArray> *)&local_98);
          }
          iVar19.i = iVar19.i + 1;
        } while (iVar19.i != iVar20.i);
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)local_1d8);
      if (local_58 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58,1,0x10);
        }
      }
      if (local_318.size == 0) {
        main_cold_13();
LAB_0010b57b:
        iVar31 = -1;
      }
      else {
        if (g_options.serial.d.size != 0) {
          QVar103.m_data = g_options.serial.d.ptr;
          QVar103.m_size = g_options.serial.d.size;
          cVar13 = QtPrivate::QStringList_contains((QList *)&local_318,QVar103,CaseSensitive);
          if (cVar13 == '\0') {
            main_cold_3();
            goto LAB_0010b57b;
          }
        }
        local_78.a = (QString *)0x0;
        local_78.b.m_size = 0;
        local_78.b.m_data = (char *)0x0;
        QVar57.m_data = (storage_type *)0x5;
        QVar57.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar57);
        local_1d8[0] = local_58[0];
        local_1d8[1] = local_58[1];
        local_1d8._2_2_ = local_58._2_2_;
        QStack_1d4.i = local_58._4_4_;
        QStack_1d0.ucs = (char16_t)pQStack_50;
        uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
        uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
        local_1c8._0_4_ = SUB84(local_48,0);
        local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
        QVar58.m_data = (storage_type *)0x7;
        QVar58.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar58);
        local_1c0.d.d = (Data *)local_58;
        local_1c0.d.ptr = (char16_t *)pQStack_50;
        local_1c0.d.size = (qsizetype)local_48;
        QVar59.m_data = (storage_type *)0x14;
        QVar59.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar59);
        local_1a8 = (QArrayData *)local_58;
        pQStack_1a0 = pQStack_50;
        local_198 = local_48;
        local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
        pQStack_50 = (QString *)QArrayData::allocate((QArrayData **)local_58,0x18,0x10,3,KeepSize);
        local_48 = (storage_type *)0x0;
        uVar27 = 0xffffffffffffffe8;
        do {
          pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
          pQStack_50[(long)local_48].d.d = pDVar1;
          pQStack_50[(long)local_48].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
          pQStack_50[(long)local_48].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27);
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_48 = local_48 + 1;
          uVar27 = uVar27 + 0x18;
        } while (uVar27 < 0x30);
        lVar15 = 0x30;
        do {
          piVar2 = *(int **)(local_1d8 + lVar15);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
            }
          }
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        execAdbCommand((QStringList *)local_58,(QByteArray *)&local_78,false);
        local_1d8[0] = (QProcessEnvironment)0x0;
        iVar31 = QByteArray::toInt((bool *)&local_78,(int)local_1d8);
        if (local_1d8[0] != (QProcessEnvironment)0x1) {
          main_cold_4();
          iVar31 = g_testInfo.sdkVersion;
        }
        g_testInfo.sdkVersion = iVar31;
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
        if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_78.a,1,0x10);
          }
        }
        local_78.a = (QString *)0x0;
        local_78.b.m_size = 0;
        local_78.b.m_data = (storage_type *)0x0;
        if (g_testInfo.sdkVersion < 0x1a) {
LAB_00109337:
          QByteArray::operator=((QByteArray *)&local_78,"0");
        }
        else {
          QVar60.m_data = (storage_type *)0x5;
          QVar60.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar60);
          local_1d8[0] = local_58[0];
          local_1d8[1] = local_58[1];
          local_1d8._2_2_ = local_58._2_2_;
          QStack_1d4.i = local_58._4_4_;
          QStack_1d0.ucs = (char16_t)pQStack_50;
          uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
          uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
          local_1c8._0_4_ = SUB84(local_48,0);
          local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
          QVar61.m_data = (storage_type *)0x3;
          QVar61.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar61);
          local_1c0.d.d = (Data *)local_58;
          local_1c0.d.ptr = (char16_t *)pQStack_50;
          local_1c0.d.size = (qsizetype)local_48;
          QVar62.m_data = (storage_type *)0x8;
          QVar62.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar62);
          local_1a8 = (QArrayData *)local_58;
          pQStack_1a0 = pQStack_50;
          local_198 = local_48;
          QVar63.m_data = (storage_type *)0x10;
          QVar63.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar63);
          local_190 = (QArrayData *)local_58;
          pQStack_188 = pQStack_50;
          local_180 = local_48;
          local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          pQStack_50 = (QString *)QArrayData::allocate((QArrayData **)local_58,0x18,0x10,4,KeepSize)
          ;
          local_48 = (storage_type *)0x0;
          uVar27 = 0xffffffffffffffe8;
          do {
            pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
            pQStack_50[(long)local_48].d.d = pDVar1;
            pQStack_50[(long)local_48].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
            pQStack_50[(long)local_48].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27);
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_48 = local_48 + 1;
            uVar27 = uVar27 + 0x18;
          } while (uVar27 < 0x48);
          lVar15 = 0x48;
          do {
            piVar2 = *(int **)(local_1d8 + lVar15);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
              }
            }
            lVar15 = lVar15 + -0x18;
          } while (lVar15 != -0x18);
          bVar12 = execAdbCommand((QStringList *)local_58,(QByteArray *)&local_78,false);
          if (!bVar12) {
            main_cold_5();
          }
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
          if (local_78.b.m_data == (storage_type *)0x0) goto LAB_00109337;
        }
        QByteArray::simplified_helper((QByteArray *)local_1d8);
        QVar64.m_data._4_4_ = local_1c8._4_4_;
        QVar64.m_data._0_4_ = (undefined4)local_1c8;
        QVar64.m_size = (qsizetype)local_58;
        QString::fromUtf8(QVar64);
        piVar2 = (int *)CONCAT44(QStack_1d4.i,
                                 CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       CONCAT44(QStack_1d4.i,
                                CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0]))),1,
                       0x10);
          }
        }
        if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_78.a,1,0x10);
          }
        }
        psVar16 = local_48;
        auVar11 = local_58;
        pcVar3 = g_testInfo.userId.d.ptr;
        pDVar1 = g_testInfo.userId.d.d;
        local_58 = (undefined1  [8])g_testInfo.userId.d.d;
        g_testInfo.userId.d.d = (Data *)auVar11;
        g_testInfo.userId.d.ptr = (char16_t *)pQStack_50;
        pQStack_50 = (QString *)pcVar3;
        local_48 = (storage_type *)g_testInfo.userId.d.size;
        g_testInfo.userId.d.size = (qsizetype)psVar16;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
          }
        }
        cVar13 = QFile::exists((QString *)&g_options.manifestPath);
        if (cVar13 == '\0') {
          main_cold_6();
          goto LAB_0010b57b;
        }
        local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
        local_78.b.m_size = -0x5555555555555556;
        QFile::QFile((QFile *)&local_78,(QString *)&g_options.manifestPath);
        cVar13 = QFile::open(&local_78,1);
        if (cVar13 != '\0') {
          local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
          QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_98,(QIODevice *)&local_78);
          cVar13 = QXmlStreamReader::atEnd();
          while (cVar13 == '\0') {
            QXmlStreamReader::readNext();
            iVar31 = QXmlStreamReader::tokenType();
            if (iVar31 == 4) {
              auVar111 = QXmlStreamReader::name();
              if ((auVar111._0_8_ == 8) &&
                 (QVar65.m_data = "manifest", QVar65.m_size = 8, QVar105.m_data = auVar111._8_8_,
                 QVar105.m_size = 8, cVar13 = QtPrivate::equalStrings(QVar65,QVar105),
                 cVar13 != '\0')) {
                QXmlStreamReader::attributes();
                QVar101.m_size = (size_t)"package";
                QVar101.field_0.m_data = local_1d8;
                auVar111 = QXmlStreamAttributes::value(QVar101);
                QString::QString((QString *)local_58,auVar111._8_8_,auVar111._0_8_);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)local_1d8);
                QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_98);
                goto LAB_00109512;
              }
            }
            cVar13 = QXmlStreamReader::atEnd();
          }
          QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_98);
        }
        local_58 = (undefined1  [8])0x0;
        pQStack_50 = (QString *)0x0;
        local_48 = (storage_type *)0x0;
LAB_00109512:
        QFile::~QFile((QFile *)&local_78);
        psVar16 = local_48;
        auVar11 = local_58;
        pcVar3 = g_options.package.d.ptr;
        pDVar1 = g_options.package.d.d;
        local_58 = (undefined1  [8])g_options.package.d.d;
        g_options.package.d.d = (Data *)auVar11;
        g_options.package.d.ptr = (char16_t *)pQStack_50;
        pQStack_50 = (QString *)pcVar3;
        local_48 = (storage_type *)g_options.package.d.size;
        g_options.package.d.size = (qsizetype)psVar16;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
          }
        }
        if (g_options.activity.d.size == 0) {
          local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
          local_78.b.m_size = -0x5555555555555556;
          QFile::QFile((QFile *)&local_78,(QString *)&g_options.manifestPath);
          cVar13 = QFile::open(&local_78,1);
          if (cVar13 != '\0') {
            local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
            QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_98,(QIODevice *)&local_78)
            ;
            cVar13 = QXmlStreamReader::atEnd();
            while (cVar13 == '\0') {
              QXmlStreamReader::readNext();
              iVar31 = QXmlStreamReader::tokenType();
              if (iVar31 == 4) {
                auVar111 = QXmlStreamReader::name();
                if ((auVar111._0_8_ == 8) &&
                   (QVar73.m_data = "activity", QVar73.m_size = 8, QVar110.m_data = auVar111._8_8_,
                   QVar110.m_size = 8, cVar13 = QtPrivate::equalStrings(QVar73,QVar110),
                   cVar13 != '\0')) {
                  QXmlStreamReader::attributes();
                  QVar102.m_size = (size_t)"android:name";
                  QVar102.field_0.m_data = local_1d8;
                  auVar111 = QXmlStreamAttributes::value(QVar102);
                  QString::QString((QString *)local_58,auVar111._8_8_,auVar111._0_8_);
                  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                            ((QArrayDataPointer<QXmlStreamAttribute> *)local_1d8);
                  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_98);
                  goto LAB_00109cb0;
                }
              }
              cVar13 = QXmlStreamReader::atEnd();
            }
            QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_98);
          }
          local_58 = (undefined1  [8])0x0;
          pQStack_50 = (QString *)0x0;
          local_48 = (storage_type *)0x0;
LAB_00109cb0:
          QFile::~QFile((QFile *)&local_78);
          psVar16 = local_48;
          auVar11 = local_58;
          pcVar3 = g_options.activity.d.ptr;
          pDVar1 = g_options.activity.d.d;
          pQVar24 = &(g_options.activity.d.d)->super_QArrayData;
          pQVar30 = (QString *)g_options.activity.d.ptr;
          qVar6 = g_options.activity.d.size;
          pQVar5 = (QArrayData *)local_58;
          g_options.activity.d.ptr = (char16_t *)pQStack_50;
          local_58 = (undefined1  [8])g_options.activity.d.d;
          g_options.activity.d.d = (Data *)auVar11;
          qVar4 = (qsizetype)local_48;
          pQStack_50 = (QString *)pcVar3;
          local_48 = (storage_type *)g_options.activity.d.size;
          g_options.activity.d.size = (qsizetype)psVar16;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
            }
          }
        }
        local_1e0 = 0xaaaaaaaaaaaaaaaa;
        QVar66.m_data = (storage_type *)0x38;
        QVar66.m_size = (qsizetype)local_1d8;
        QString::fromLatin1(QVar66);
        local_58[1] = local_1d8[1];
        local_58[0] = local_1d8[0];
        local_58._2_2_ = local_1d8._2_2_;
        local_58._4_4_ = QStack_1d4.i;
        pQStack_50 = (QString *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
        local_48 = (storage_type *)CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_1e0,local_58,0);
        if (local_58 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
          }
        }
        local_1e8 = 0xaaaaaaaaaaaaaaaa;
        QVar67.m_data = (storage_type *)0x3c;
        QVar67.m_size = (qsizetype)local_1d8;
        QString::fromLatin1(QVar67);
        local_58[1] = local_1d8[1];
        local_58[0] = local_1d8[0];
        local_58._2_2_ = local_1d8._2_2_;
        local_58._4_4_ = QStack_1d4.i;
        pQStack_50 = (QString *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
        local_48 = (storage_type *)CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_1e8,local_58,0);
        if (local_58 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
          }
        }
        iVar31 = 0;
        local_98.size = 0;
        local_98.d = (Data *)0x0;
        local_98.ptr = (QString *)0x0;
        local_208.d.size = 0;
        local_208.d.d = (Data *)0x0;
        local_208.d.ptr = (char16_t *)0x0;
        local_228.size = 0;
        local_228.d = (Data *)0x0;
        local_228.ptr = (QString *)0x0;
        if (g_options.testArgsList.d.size != 0) {
          lVar15 = 0;
          do {
            QList<QString>::data(&g_options.testArgsList);
            QString::trimmed_helper((QString *)local_58);
            pQVar30 = pQStack_50;
            if (local_48 == (storage_type *)0x2) {
              QVar68.m_data = (storage_type_conflict *)pQStack_50;
              QVar68.m_size = 2;
              QVar106.m_data = "--";
              QVar106.m_size = 2;
              cVar13 = QtPrivate::equalStrings(QVar68,QVar106);
              bVar12 = false;
              if (cVar13 == '\0') {
                QVar69.m_data = (storage_type_conflict *)pQVar30;
                QVar69.m_size = 2;
                QVar107.m_data = "-o";
                QVar107.m_size = 2;
                cVar13 = QtPrivate::equalStrings(QVar69,QVar107);
                if (cVar13 == '\0') goto LAB_001098df;
                bVar12 = true;
                if (g_options.testArgsList.d.size + -1 <= lVar15) goto LAB_00109b32;
                iVar31 = iVar31 + 1;
                pQVar22 = QList<QString>::data(&g_options.testArgsList);
                local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
                pQVar32 = &local_78;
                QRegularExpression::match(pQVar32,&local_1e8,pQVar22 + iVar31,0,0,0);
                cVar13 = QRegularExpressionMatch::hasMatch();
                if (cVar13 == '\0') {
                  QString::operator=((QString *)&local_98,(QString *)(pQVar22 + iVar31));
                }
                else {
                  local_1c8._0_4_ = 0xaaaaaaaa;
                  local_1c8._4_4_ = 0xaaaaaaaa;
                  local_1d8[0] = (QProcessEnvironment)0xaa;
                  local_1d8[1] = 0xaa;
                  local_1d8._2_2_ = 0xaaaa;
                  QStack_1d4.i = 0xaaaaaaaa;
                  QStack_1d0.ucs = L'ꪪ';
                  uStack_1ce = 0xaaaa;
                  uStack_1cc = 0xaaaaaaaa;
                  QRegularExpressionMatch::capturedTexts();
                  lVar15 = CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
                  local_240.d.d = *(Data **)(lVar15 + 0x18);
                  local_240.d.ptr = *(char16_t **)(lVar15 + 0x20);
                  local_240.d.size = *(qsizetype *)(lVar15 + 0x28);
                  if (&(local_240.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_240.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                    lVar15 = CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
                  }
                  local_258.d.d = *(Data **)(lVar15 + 0x30);
                  local_258.d.ptr = *(char16_t **)(lVar15 + 0x38);
                  local_258.d.size = *(qsizetype *)(lVar15 + 0x40);
                  if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_258.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  setOutputFile(&local_240,&local_258);
                  if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_258.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_240.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_240.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_240.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_1d8);
                }
                goto LAB_00109b2a;
              }
            }
            else {
LAB_001098df:
              local_288.a = (QString *)0xaaaaaaaaaaaaaaaa;
              QRegularExpression::match(&local_288,&local_1e0,local_58,0,0,0);
              cVar13 = QRegularExpressionMatch::hasMatch();
              pQVar32 = &local_288;
              if (cVar13 == '\0') {
                local_78.b.m_data = (char *)0xaaaaaaaaaaaaaaaa;
                local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
                local_78.b.m_size = -0x5555555555555556;
                local_1d8[0] = local_58[0];
                local_1d8[1] = local_58[1];
                local_1d8._2_2_ = local_58._2_2_;
                QStack_1d4.i = local_58._4_4_;
                QStack_1d0.ucs = (char16_t)pQStack_50;
                uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
                uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
                local_1c8._0_4_ = SUB84(local_48,0);
                local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
                if (local_58 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QArrayData *)local_58)->ref_)._q_value.super___atomic_base<int>._M_i =
                       (((QArrayData *)local_58)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                QVar70.m_data = (char *)0x1;
                QVar70.m_size = (qsizetype)local_1d8;
                QVar108.m_data = (char *)0x6;
                QVar108.m_size = (qsizetype)"\"";
                plVar23 = (long *)QString::replace(QVar70,QVar108,0x1120d4);
                local_78.a = (QString *)*plVar23;
                local_78.b.m_size = plVar23[1];
                local_78.b.m_data = (char *)plVar23[2];
                if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QArrayData *)local_78.a)->ref_)._q_value.super___atomic_base<int>._M_i =
                       (((QArrayData *)local_78.a)->ref_)._q_value.super___atomic_base<int>._M_i + 1
                  ;
                  UNLOCK();
                }
                piVar2 = (int *)CONCAT44(QStack_1d4.i,
                                         CONCAT22(local_1d8._2_2_,
                                                  CONCAT11(local_1d8[1],local_1d8[0])));
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)
                               CONCAT44(QStack_1d4.i,
                                        CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])
                                                )),2,0x10);
                  }
                }
                QVar71.m_data = (char *)0x1;
                QVar71.m_size = (qsizetype)&local_78;
                QVar109.m_data = (char *)0x1;
                QVar109.m_size = (qsizetype)"\'";
                QString::replace(QVar71,QVar109,0x11172e);
                local_1c8._4_4_ = (uint)((ulong)local_78.b.m_data >> 0x20) | 0x80000000;
                local_1d8[0] = (QProcessEnvironment)0x1;
                QStack_1d0.ucs = (char16_t)local_78.b.m_size;
                uStack_1ce = (undefined2)((ulong)local_78.b.m_size >> 0x10);
                uStack_1cc = (undefined4)((ulong)local_78.b.m_size >> 0x20);
                local_1c8._0_4_ = SUB84(local_78.b.m_data,0);
                local_b8.d.d = (Data *)local_1d8;
                local_b8.d.ptr = (char16_t *)0x0;
                QVar72.m_size = (size_t)" \\\"%1\\\"";
                QVar72.field_0.m_data = &local_270;
                QtPrivate::argToQString(QVar72,0x4000000000000007,(ArgBase **)0x1);
                QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                          ((QMovableArrayOps<QString> *)&local_228,local_228.size,&local_270);
                QList<QString>::end((QList<QString> *)&local_228);
                if (&(local_270.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_270.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
                  }
                }
              }
              else {
                QRegularExpressionMatch::capturedTexts();
                QString::operator=(&local_208,
                                   (QString *)
                                   (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs)) + 0x18)
                                  );
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_1d8);
              }
LAB_00109b2a:
              QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)pQVar32);
              bVar12 = false;
            }
LAB_00109b32:
            if (local_58 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_58,2,0x10);
              }
            }
            if (bVar12) {
              bVar12 = false;
              goto LAB_0010a8b1;
            }
            iVar31 = iVar31 + 1;
            lVar15 = (long)iVar31;
          } while (lVar15 < g_options.testArgsList.d.size);
        }
        lVar15 = local_98.size;
        if (((g_options.outFiles.d == (Data *)0x0) || ((g_options.outFiles.d)->size == 0)) ||
           (local_98.size != 0)) {
LAB_00109d2f:
          local_270.d.d = (Data *)local_98.d;
          local_270.d.ptr = (char16_t *)local_98.ptr;
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_b8.d.d = local_208.d.d;
          local_b8.d.ptr = local_208.d.ptr;
          local_b8.d.size = local_208.d.size;
          if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
          local_270.d.size = lVar15;
          setOutputFile(&local_270,&local_b8);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_270.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_270.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else if (local_208.d.size != 0) {
          lVar15 = 0;
          goto LAB_00109d2f;
        }
        local_288.a = (QString *)0x0;
        local_288.b.m_size = 0;
        local_288.b.m_data = (storage_type *)0x0;
        if (g_options.outFiles.d == (Data *)0x0) {
          uVar27 = 0;
          QVar33.d = (Data *)0x0;
LAB_00109e7a:
          if (QVar33.d != (Data *)0x0 || uVar27 != 0) goto LAB_00109e86;
        }
        else {
          QVar33.d = g_options.outFiles.d;
          if ((g_options.outFiles.d)->spans->offsets[0] == 0xff) {
            uVar28 = 1;
            do {
              uVar27 = uVar28;
              if ((g_options.outFiles.d)->numBuckets == uVar27) {
                QVar33.d = (Data *)0x0;
                uVar27 = 0;
                break;
              }
              uVar28 = uVar27 + 1;
            } while ((g_options.outFiles.d)->spans[uVar27 >> 7].offsets[(uint)uVar27 & 0x7f] == 0xff
                    );
            goto LAB_00109e7a;
          }
          uVar27 = 0;
LAB_00109e86:
          do {
            lVar34 = (uVar27 >> 3 & 0xfffffffffffffff0) * 9;
            uVar28 = (ulong)((uint)uVar27 & 0x7f);
            QFileInfo::QFileInfo
                      ((QFileInfo *)&local_f8,
                       (QString *)
                       (*(long *)((QVar33.d)->spans->offsets + lVar34 + 0x80) +
                        (ulong)((uint)(QVar33.d)->spans->offsets[uVar28 + lVar34] * 0x30) + 0x18));
            QFileInfo::fileName();
            lVar15 = *(long *)((QVar33.d)->spans->offsets + lVar34 + 0x80);
            uVar28 = (ulong)((uint)(QVar33.d)->spans->offsets[uVar28 + lVar34] * 0x30);
            local_48 = (storage_type *)(local_2a8.size | 0x8000000000000000);
            local_58[0] = 1;
            pQStack_50 = local_2a8.ptr;
            local_78.b.m_size = *(undefined8 *)(lVar15 + 8 + uVar28);
            local_78.b.m_data = (char *)(*(ulong *)(lVar15 + 0x10 + uVar28) | 0x8000000000000000);
            local_78.a = (QString *)CONCAT71(local_78.a._1_7_,1);
            local_1d8[0] = SUB81(local_58,0);
            local_1d8[1] = (undefined1)((ulong)local_58 >> 8);
            local_1d8._2_2_ = (undefined2)((ulong)local_58 >> 0x10);
            QStack_1d4.i = (Int)((ulong)local_58 >> 0x20);
            QStack_1d0.ucs = (char16_t)&local_78;
            uStack_1ce = (undefined2)((ulong)&local_78 >> 0x10);
            uStack_1cc = (undefined4)((ulong)&local_78 >> 0x20);
            local_1c8._0_4_ = 0;
            local_1c8._4_4_ = 0;
            QVar74.m_size = (size_t)"-o %1,%2 ";
            QVar74.field_0.m_data = &local_d8;
            QtPrivate::argToQString(QVar74,0x4000000000000009,(ArgBase **)0x2);
            QString::append((QString *)&local_288);
            if (local_d8 != (QArrayData *)0x0) {
              LOCK();
              (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_d8,2,0x10);
              }
            }
            if (&(local_2a8.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate(&(local_2a8.d)->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
            do {
              if ((QVar33.d)->numBuckets - 1 == uVar27) {
                uVar27 = 0;
                QVar33.d = (Data *)0x0;
                break;
              }
              uVar27 = uVar27 + 1;
            } while ((QVar33.d)->spans[uVar27 >> 7].offsets[(uint)uVar27 & 0x7f] == 0xff);
          } while ((uVar27 != 0) || (QVar33.d != (Data *)0x0));
        }
        local_1d8[0] = (QProcessEnvironment)0x20;
        local_1d8[1] = 0;
        QtPrivate::QStringList_join((QList *)local_58,(QChar *)&local_228,(longlong)local_1d8);
        QString::trimmed_helper((QString *)local_1d8);
        QString::append((QString *)&local_288);
        piVar2 = (int *)CONCAT44(QStack_1d4.i,
                                 CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       CONCAT44(QStack_1d4.i,
                                CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0]))),2,
                       0x10);
          }
        }
        if (local_58 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
          }
        }
        QString::trimmed_helper((QString *)&local_78);
        local_1c8._4_4_ = (uint)((ulong)local_78.b.m_data >> 0x20) | 0x80000000;
        local_1d8[0] = (QProcessEnvironment)0x1;
        QStack_1d0.ucs = (char16_t)local_78.b.m_size;
        uStack_1ce = (undefined2)((ulong)local_78.b.m_size >> 0x10);
        uStack_1cc = (undefined4)((ulong)local_78.b.m_size >> 0x20);
        local_1c8._0_4_ = SUB84(local_78.b.m_data,0);
        uStack_d0 = (QString *)0x0;
        QVar75.m_size = (size_t)"\"%1\"";
        QVar75.field_0.m_data = local_58;
        local_d8 = (QArrayData *)local_1d8;
        QtPrivate::argToQString(QVar75,0x4000000000000004,(ArgBase **)0x1);
        psVar16 = local_48;
        auVar11 = local_58;
        qVar4 = local_288.b.m_size;
        pQVar30 = local_288.a;
        local_58 = (undefined1  [8])local_288.a;
        local_288.a = (QString *)auVar11;
        local_288.b.m_size = (qsizetype)pQStack_50;
        pQStack_50 = (QString *)qVar4;
        local_48 = local_288.b.m_data;
        local_288.b.m_data = psVar16;
        if ((QArrayData *)pQVar30 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&pQVar30->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&pQVar30->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&pQVar30->d)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)pQVar30,2,0x10);
          }
        }
        if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
          }
        }
        local_78.b.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
        local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
        local_78.b.m_size = -0x5555555555555556;
        local_1c8._4_4_ = (uint)((ulong)g_options.package.d.size >> 0x20) | 0x80000000;
        local_1d8[0] = (QProcessEnvironment)0x1;
        QStack_1d0.ucs = (char16_t)g_options.package.d.ptr;
        uStack_1ce = (undefined2)((ulong)g_options.package.d.ptr >> 0x10);
        uStack_1cc = (undefined4)((ulong)g_options.package.d.ptr >> 0x20);
        local_1c8._0_4_ = (undefined4)g_options.package.d.size;
        uStack_d0 = (QString *)0x0;
        QVar76.m_size = (size_t)"%1/%2";
        QVar76.field_0.m_data = local_58;
        local_d8 = (QArrayData *)local_1d8;
        QtPrivate::argToQString(QVar76,0x4000000000000005,(ArgBase **)0x1);
        QVar77.m_size = (size_t)local_58;
        QVar77.field_0.m_data = &local_78;
        QString::arg_impl(QVar77,(int)g_options.activity.d.ptr,
                          (QChar)(char16_t)g_options.activity.d.size);
        if (local_58 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58,2,0x10);
          }
        }
        local_d8 = (QArrayData *)0x0;
        uStack_d0 = (QString *)0x0;
        local_c8 = (storage_type *)0x0;
        local_2a8.size = 0xaaaaaaaaaaaaaaaa;
        local_2a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_2a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
        QProcessEnvironment::systemEnvironment();
        QProcessEnvironment::toStringList();
        QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)local_1d8);
        if (local_2a8.size != 0) {
          lVar15 = local_2a8.size * 0x18;
          pQVar30 = local_2a8.ptr;
          do {
            QVar78.m_data = (char *)0x6;
            QVar78.m_size = (qsizetype)pQVar30;
            cVar13 = QString::startsWith(QVar78,0x1120f8);
            if ((cVar13 != '\0') ||
               (QVar79.m_data = (char *)0x3, QVar79.m_size = (qsizetype)pQVar30,
               cVar13 = QString::startsWith(QVar79,0x1120ff), cVar13 != '\0')) {
              pcVar3 = (pQVar30->d).ptr;
              qVar4 = (pQVar30->d).size;
              local_1c8._4_4_ = (uint)((ulong)qVar4 >> 0x20) | 0x80000000;
              local_1d8[0] = (QProcessEnvironment)0x1;
              QStack_1d0.ucs = (char16_t)pcVar3;
              uStack_1ce = (undefined2)((ulong)pcVar3 >> 0x10);
              uStack_1cc = (undefined4)((ulong)pcVar3 >> 0x20);
              local_1c8._0_4_ = (undefined4)qVar4;
              local_f8 = (QArrayData *)local_1d8;
              local_f0 = 0;
              QVar80.m_size = (size_t)"%1 ";
              QVar80.field_0.m_data = local_58;
              QtPrivate::argToQString(QVar80,0x4000000000000003,(ArgBase **)0x1);
              QString::append((QString *)&local_d8);
              if (local_58 != (undefined1  [8])0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_58,2,0x10);
                }
              }
            }
            pQVar30 = pQVar30 + 1;
            lVar15 = lVar15 + -0x18;
          } while (lVar15 != 0);
        }
        if (local_c8 != (storage_type *)0x0) {
          QString::trimmed_helper((QString *)local_2c0);
          QString::toUtf8_helper((QString *)&local_f8);
          QByteArray::toBase64(local_58,&local_f8,0);
          QVar81.m_data = local_48;
          QVar81.m_size = (qsizetype)local_1d8;
          QString::fromUtf8(QVar81);
          pQVar24 = local_d8;
          pQVar5 = (QArrayData *)
                   CONCAT44(QStack_1d4.i,
                            CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
          pQVar30 = (QString *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
          local_1d8[0] = SUB81(local_d8,0);
          local_1d8[1] = (undefined1)((ulong)local_d8 >> 8);
          local_1d8._2_2_ = (undefined2)((ulong)local_d8 >> 0x10);
          QStack_1d4.i = (Int)((ulong)local_d8 >> 0x20);
          psVar16 = (storage_type *)CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
          QStack_1d0.ucs = (char16_t)uStack_d0;
          uStack_1ce = (undefined2)((ulong)uStack_d0 >> 0x10);
          uStack_1cc = (undefined4)((ulong)uStack_d0 >> 0x20);
          local_1c8._0_4_ = SUB84(local_c8,0);
          local_1c8._4_4_ = (uint)((ulong)local_c8 >> 0x20);
          uStack_d0 = pQVar30;
          local_c8 = psVar16;
          if (local_d8 != (QArrayData *)0x0) {
            LOCK();
            (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              local_d8 = pQVar5;
              QArrayData::deallocate(pQVar24,2,0x10);
              pQVar5 = local_d8;
            }
          }
          local_d8 = pQVar5;
          if (local_58 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_58,1,0x10);
            }
          }
          pQVar5 = local_f8;
          if (local_f8 != (QArrayData *)0x0) {
            LOCK();
            (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f8,1,0x10);
            }
          }
          if (local_2c0[0] != (QArrayData *)0x0) {
            LOCK();
            (local_2c0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_2c0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_2c0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_2c0[0],2,0x10);
            }
          }
          local_1c8._4_4_ = (uint)((ulong)local_c8 >> 0x20) | 0x80000000;
          local_1d8[0] = (QProcessEnvironment)0x1;
          QStack_1d0.ucs = (char16_t)uStack_d0;
          uStack_1ce = (undefined2)((ulong)uStack_d0 >> 0x10);
          uStack_1cc = (undefined4)((ulong)uStack_d0 >> 0x20);
          local_1c8._0_4_ = SUB84(local_c8,0);
          local_f0 = 0;
          QVar82.m_size = (size_t)"-e extraenvvars \"%4\"";
          QVar82.field_0.m_data = local_58;
          local_f8 = (QArrayData *)local_1d8;
          QtPrivate::argToQString(QVar82,0x4000000000000014,(ArgBase **)0x1);
          psVar16 = local_48;
          auVar11 = local_58;
          pQVar30 = uStack_d0;
          pQVar5 = local_d8;
          local_58 = (undefined1  [8])local_d8;
          local_d8 = (QArrayData *)auVar11;
          uStack_d0 = pQStack_50;
          pQStack_50 = pQVar30;
          local_48 = local_c8;
          local_c8 = psVar16;
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
        }
        QVar83.m_data = (storage_type *)0x5;
        QVar83.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar83);
        local_1d8[0] = local_58[0];
        local_1d8[1] = local_58[1];
        local_1d8._2_2_ = local_58._2_2_;
        QStack_1d4.i = local_58._4_4_;
        QStack_1d0.ucs = (char16_t)pQStack_50;
        uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
        uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
        local_1c8._0_4_ = SUB84(local_48,0);
        local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
        QVar84.m_data = (storage_type *)0x2;
        QVar84.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar84);
        local_1c0.d.d = (Data *)local_58;
        local_1c0.d.ptr = (char16_t *)pQStack_50;
        local_1c0.d.size = (qsizetype)local_48;
        QVar85.m_data = (storage_type *)0x5;
        QVar85.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar85);
        local_1a8 = (QArrayData *)local_58;
        pQStack_1a0 = pQStack_50;
        local_198 = local_48;
        QVar86.m_data = (storage_type *)0x2;
        QVar86.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar86);
        local_190 = (QArrayData *)local_58;
        pQStack_188 = pQStack_50;
        local_180 = local_48;
        local_178 = (QArrayData *)local_78.a;
        local_170 = (QString *)local_78.b.m_size;
        psStack_168 = local_78.b.m_data;
        if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar87.m_data = (storage_type *)0x2;
        QVar87.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar87);
        local_160 = (QArrayData *)local_58;
        pQStack_158 = pQStack_50;
        local_150 = local_48;
        QVar88.m_data = (storage_type *)0x14;
        QVar88.m_size = (qsizetype)local_58;
        QString::fromLatin1(QVar88);
        local_148 = (QArrayData *)local_58;
        pQStack_140 = pQStack_50;
        local_138 = local_48;
        local_130 = (QArrayData *)local_288.a;
        local_128 = (QString *)local_288.b.m_size;
        psStack_120 = local_288.b.m_data;
        if ((QArrayData *)local_288.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_288.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_288.a)->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_118 = local_d8;
        local_110 = (undefined4)uStack_d0;
        uStack_10c = uStack_d0._4_4_;
        uStack_108 = (undefined4)local_c8;
        uStack_104 = local_c8._4_4_;
        if (local_d8 != (QArrayData *)0x0) {
          LOCK();
          (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<QString>::assign<QString_const*,q20::identity>
                  (&g_options.amStarttestArgs.d,local_1d8,local_100);
        lVar15 = 0xc0;
        do {
          piVar2 = *(int **)(local_1d8 + lVar15);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
            }
          }
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != -0x18);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_2a8);
        if (local_d8 != (QArrayData *)0x0) {
          LOCK();
          (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d8,2,0x10);
          }
        }
        if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
          }
        }
        if ((QArrayData *)local_288.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_288.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_288.a)->d)->_q_value).super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_288.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_288.a,2,0x10);
          }
        }
        bVar12 = true;
LAB_0010a8b1:
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_228);
        if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
          }
        }
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1e8);
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1e0);
        iVar31 = -1;
        if (bVar12) {
          testRunnerLock.isAcquired._M_base._M_i = (__atomic_base<bool>)QSystemSemaphore::acquire();
          LOCK();
          UNLOCK();
          local_98.size = -0x5555555555555556;
          local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_98.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
          QVar89.m_data = (storage_type *)0x7;
          QVar89.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar89);
          local_1d8[0] = local_58[0];
          local_1d8[1] = local_58[1];
          local_1d8._2_2_ = local_58._2_2_;
          QStack_1d4.i = local_58._4_4_;
          QStack_1d0.ucs = (char16_t)pQStack_50;
          uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
          uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
          local_1c8._0_4_ = SUB84(local_48,0);
          local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
          QVar90.m_data = (storage_type *)0x2;
          QVar90.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar90);
          local_1c0.d.d = (Data *)local_58;
          local_1c0.d.ptr = (char16_t *)pQStack_50;
          local_1c0.d.size = (qsizetype)local_48;
          QVar91.m_data = (storage_type *)0x2;
          QVar91.m_size = (qsizetype)local_58;
          QString::fromLatin1(QVar91);
          local_1a8 = (QArrayData *)local_58;
          pQStack_1a0 = pQStack_50;
          local_198 = local_48;
          local_190 = &(g_options.apkPath.d.d)->super_QArrayData;
          pQStack_188 = (QString *)g_options.apkPath.d.ptr;
          local_180 = (storage_type *)g_options.apkPath.d.size;
          if (g_options.apkPath.d.d != (Data *)0x0) {
            LOCK();
            ((g_options.apkPath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((g_options.apkPath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          local_98.ptr = (QString *)
                         QArrayData::allocate((QArrayData **)local_58,0x18,0x10,4,KeepSize);
          local_98.d = (Data *)local_58;
          local_98.size = 0;
          uVar27 = 0xffffffffffffffe8;
          do {
            pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
            local_98.ptr[local_98.size].d.d = pDVar1;
            local_98.ptr[local_98.size].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
            local_98.ptr[local_98.size].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27);
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_98.size = local_98.size + 1;
            uVar27 = uVar27 + 0x18;
          } while (uVar27 < 0x48);
          lVar15 = 0x48;
          do {
            piVar2 = *(int **)(local_1d8 + lVar15);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
              }
            }
            lVar15 = lVar15 + -0x18;
          } while (lVar15 != -0x18);
          g_testInfo.isPackageInstalled._M_base._M_i =
               (__atomic_base<bool>)execAdbCommand((QStringList *)&local_98,(QByteArray *)0x0,true);
          LOCK();
          UNLOCK();
          iVar31 = -1;
          if ((bool)g_testInfo.isPackageInstalled._M_base._M_i) {
            args = QList<QList<QString>_>::begin(&g_options.preTestRunAdbCommands);
            iVar25 = QList<QList<QString>_>::end(&g_options.preTestRunAdbCommands);
            if (args.i != iVar25.i) {
              iVar31 = 0;
              do {
                local_58 = (undefined1  [8])0x0;
                pQStack_50 = (QString *)0x0;
                local_48 = (storage_type *)0x0;
                bVar12 = execAdbCommand(args.i,(QByteArray *)local_58,true);
                if (!bVar12) {
                  local_1d8[0] = (QProcessEnvironment)0x2;
                  local_1d8[1] = 0;
                  local_1d8._2_2_ = 0;
                  QStack_1d4.i = 0;
                  QStack_1d0.ucs = L'\0';
                  uStack_1ce = 0;
                  uStack_1cc = 0;
                  local_1c8._0_4_ = 0;
                  local_1c8._4_4_ = 0;
                  local_1c0.d.d = (Data *)0x1116c6;
                  local_78.a = (QString *)CONCAT62(local_78.a._2_6_,0x20);
                  QtPrivate::QStringList_join
                            ((QList *)&local_208,(QChar *)args.i,(longlong)&local_78);
                  QString::toUtf8_helper((QString *)&local_78);
                  pQVar30 = (QString *)local_78.b.m_size;
                  if ((QString *)local_78.b.m_size == (QString *)0x0) {
                    pQVar30 = (QString *)&QByteArray::_empty;
                  }
                  pQVar29 = pQStack_50;
                  if (pQStack_50 == (QString *)0x0) {
                    pQVar29 = (QString *)&QByteArray::_empty;
                  }
                  QMessageLogger::critical
                            (local_1d8,"The pre test ADB command \"%s\" failed with output:\n%s",
                             pQVar30,pQVar29);
                  if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_78.a,1,0x10);
                    }
                  }
                  if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_208.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  iVar31 = -1;
                }
                if (local_58 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0)
                  {
                    QArrayData::deallocate((QArrayData *)local_58,1,0x10);
                  }
                }
                if (!bVar12) goto LAB_0010b4c2;
                args.i = args.i + 1;
              } while (args.i != iVar25.i);
            }
            local_208.d.size = -0x5555555555555556;
            local_208.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_208.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            QVar92.m_data = (storage_type *)((ulong)(0x17 < g_testInfo.sdkVersion) * 3 + 0x12);
            QVar92.m_size = (qsizetype)local_1d8;
            QString::fromLatin1(QVar92);
            pQVar5 = (QArrayData *)
                     CONCAT44(QStack_1d4.i,
                              CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
            pQVar30 = (QString *)CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,QStack_1d0.ucs));
            uVar27 = CONCAT44(local_1c8._4_4_,(undefined4)local_1c8);
            QVar93.m_data = (storage_type *)0x5;
            QVar93.m_size = (qsizetype)local_58;
            QString::fromLatin1(QVar93);
            local_1d8[0] = local_58[0];
            local_1d8[1] = local_58[1];
            local_1d8._2_2_ = local_58._2_2_;
            QStack_1d4.i = local_58._4_4_;
            QStack_1d0.ucs = (char16_t)pQStack_50;
            uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
            uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
            local_1c8._0_4_ = SUB84(local_48,0);
            local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
            QVar94.m_data = (storage_type *)0x4;
            QVar94.m_size = (qsizetype)local_58;
            QString::fromLatin1(QVar94);
            local_1c0.d.d = (Data *)local_58;
            local_1c0.d.ptr = (char16_t *)pQStack_50;
            local_1c0.d.size = (qsizetype)local_48;
            local_58[0] = 1;
            local_78.b.m_size = 0;
            QVar95.m_size = (size_t)"+\'%1\'";
            QVar95.field_0.m_data = &local_1a8;
            local_78.a = (QString *)local_58;
            pQStack_50 = pQVar30;
            local_48 = (storage_type *)(uVar27 | 0x8000000000000000);
            QtPrivate::argToQString(QVar95,0x4000000000000005,(ArgBase **)0x1);
            local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
            pQStack_50 = (QString *)
                         QArrayData::allocate((QArrayData **)local_58,0x18,0x10,3,KeepSize);
            local_48 = (storage_type *)0x0;
            uVar27 = 0xffffffffffffffe8;
            do {
              pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
              pQStack_50[(long)local_48].d.d = pDVar1;
              pQStack_50[(long)local_48].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
              pQStack_50[(long)local_48].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27);
              if (pDVar1 != (Data *)0x0) {
                LOCK();
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_48 = local_48 + 1;
              uVar27 = uVar27 + 0x18;
            } while (uVar27 < 0x30);
            lVar15 = 0x30;
            do {
              piVar2 = *(int **)(local_1d8 + lVar15);
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
                }
              }
              lVar15 = lVar15 + -0x18;
            } while (lVar15 != -0x18);
            local_1d8[0] = (QProcessEnvironment)0x0;
            local_1d8[1] = 0;
            local_1d8._2_2_ = 0;
            QStack_1d4.i = 0;
            QStack_1d0.ucs = L'\0';
            uStack_1ce = 0;
            uStack_1cc = 0;
            local_1c8._0_4_ = 0;
            local_1c8._4_4_ = 0;
            bVar12 = execAdbCommand((QStringList *)local_58,(QByteArray *)local_1d8,false);
            if (bVar12) {
              QByteArray::simplified_helper((QByteArray *)&local_78);
              QVar96.m_data = local_78.b.m_data;
              QVar96.m_size = (qsizetype)&local_208;
              QString::fromUtf8(QVar96);
              if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_78.a,1,0x10);
                }
              }
            }
            else {
              main_cold_7();
            }
            piVar2 = (int *)CONCAT44(QStack_1d4.i,
                                     CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0])));
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)
                           CONCAT44(QStack_1d4.i,
                                    CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0]))),1
                           ,0x10);
              }
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
            if (pQVar5 != (QArrayData *)0x0) {
              LOCK();
              (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar5,2,0x10);
              }
            }
            bVar12 = execAdbCommand(&g_options.amStarttestArgs,(QByteArray *)0x0,true);
            iVar31 = -1;
            if (bVar12) {
              local_1d8[0] = (QProcessEnvironment)0xaa;
              local_1d8[1] = 0xaa;
              local_1d8._2_2_ = 0xaaaa;
              QStack_1d4.i = 0xaaaaaaaa;
              QStack_1d0.ucs = L'ꪪ';
              uStack_1ce = 0xaaaa;
              uStack_1cc = 0xaaaaaaaa;
              QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_1d8,10000,CoarseTimer);
              while (g_testInfo.pid = getPid(&g_options.package), g_testInfo.pid < 1) {
                QThread::msleep(100);
                cVar13 = QDeadlineTimer::hasExpired();
                if ((cVar13 != '\0') ||
                   (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) != 0)) break;
              }
              local_78.b.m_data = (char *)0xaaaaaaaaaaaaaaaa;
              local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
              local_78.b.m_size = -0x5555555555555556;
              local_1c8._4_4_ = (uint)((ulong)g_options.stdoutFileName.d.size >> 0x20) | 0x80000000;
              local_1d8[0] = (QProcessEnvironment)0x1;
              QStack_1d0.ucs = (char16_t)g_options.stdoutFileName.d.ptr;
              uStack_1ce = (undefined2)((ulong)g_options.stdoutFileName.d.ptr >> 0x10);
              uStack_1cc = (undefined4)((ulong)g_options.stdoutFileName.d.ptr >> 0x20);
              local_1c8._0_4_ = (undefined4)g_options.stdoutFileName.d.size;
              pQStack_50 = (QString *)0x0;
              QVar97.m_size = (size_t)"ls files/%1";
              QVar97.field_0.m_data = &local_78;
              local_58 = (undefined1  [8])local_1d8;
              QtPrivate::argToQString(QVar97,0x400000000000000b,(ArgBase **)0x1);
              QVar98.m_data = (storage_type *)0x5;
              QVar98.m_size = (qsizetype)local_58;
              QString::fromLatin1(QVar98);
              local_1d8[0] = local_58[0];
              local_1d8[1] = local_58[1];
              local_1d8._2_2_ = local_58._2_2_;
              QStack_1d4.i = local_58._4_4_;
              QStack_1d0.ucs = (char16_t)pQStack_50;
              uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
              uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
              local_1c8._0_4_ = SUB84(local_48,0);
              local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
              runCommandAsUserArgs(&local_1c0,(QString *)local_78.b.m_size);
              local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
              pQStack_50 = (QString *)
                           QArrayData::allocate((QArrayData **)local_58,0x18,0x10,2,KeepSize);
              local_48 = (storage_type *)0x0;
              uVar27 = 0xffffffffffffffe8;
              do {
                pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
                pQStack_50[(long)local_48].d.d = pDVar1;
                pQStack_50[(long)local_48].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
                pQStack_50[(long)local_48].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27)
                ;
                if (pDVar1 != (Data *)0x0) {
                  LOCK();
                  (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                local_48 = (storage_type *)((long)local_48 + 1);
                bVar12 = 0xffffffffffffffe7 < uVar27;
                uVar27 = uVar27 + 0x18;
              } while (bVar12);
              lVar15 = 0x18;
              do {
                piVar2 = *(int **)(local_1d8 + lVar15);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
                  }
                }
                lVar15 = lVar15 + -0x18;
              } while (lVar15 != -0x18);
              local_1d8[0] = (QProcessEnvironment)0xaa;
              local_1d8[1] = 0xaa;
              local_1d8._2_2_ = 0xaaaa;
              QStack_1d4.i = 0xaaaaaaaa;
              QStack_1d0.ucs = L'ꪪ';
              uStack_1ce = 0xaaaa;
              uStack_1cc = 0xaaaaaaaa;
              QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_1d8,5000,CoarseTimer);
              while (bVar12 = execAdbCommand((QStringList *)local_58,(QByteArray *)0x0,false),
                    !bVar12) {
                QThread::msleep(100);
                cVar13 = QDeadlineTimer::hasExpired();
                if ((cVar13 != '\0') ||
                   (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) != 0)) break;
              }
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58)
              ;
              if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
                }
              }
              local_78.b.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
              local_78.a = (QString *)0xaaaaaaaaaaaaaaaa;
              local_78.b.m_size = -0x5555555555555556;
              local_1c8._4_4_ = (uint)((ulong)g_options.stdoutFileName.d.size >> 0x20) | 0x80000000;
              local_1d8[0] = (QProcessEnvironment)0x1;
              QStack_1d0.ucs = (char16_t)g_options.stdoutFileName.d.ptr;
              uStack_1ce = (undefined2)((ulong)g_options.stdoutFileName.d.ptr >> 0x10);
              uStack_1cc = (undefined4)((ulong)g_options.stdoutFileName.d.ptr >> 0x20);
              local_1c8._0_4_ = (undefined4)g_options.stdoutFileName.d.size;
              pQStack_50 = (QString *)0x0;
              QVar99.m_size = (size_t)"tail -n +1 -f files/%1";
              QVar99.field_0.m_data = &local_78;
              local_58 = (undefined1  [8])local_1d8;
              QtPrivate::argToQString(QVar99,0x4000000000000016,(ArgBase **)0x1);
              QVar100.m_data = (storage_type *)0x5;
              QVar100.m_size = (qsizetype)local_58;
              QString::fromLatin1(QVar100);
              local_1d8[0] = local_58[0];
              local_1d8[1] = local_58[1];
              local_1d8._2_2_ = local_58._2_2_;
              QStack_1d4.i = local_58._4_4_;
              QStack_1d0.ucs = (char16_t)pQStack_50;
              uStack_1ce = (undefined2)((ulong)pQStack_50 >> 0x10);
              uStack_1cc = (undefined4)((ulong)pQStack_50 >> 0x20);
              local_1c8._0_4_ = SUB84(local_48,0);
              local_1c8._4_4_ = (uint)((ulong)local_48 >> 0x20);
              runCommandAsUserArgs(&local_1c0,(QString *)local_78.b.m_size);
              local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
              pQStack_50 = (QString *)
                           QArrayData::allocate((QArrayData **)local_58,0x18,0x10,2,KeepSize);
              local_48 = (storage_type *)0x0;
              uVar27 = 0xffffffffffffffe8;
              do {
                pDVar1 = *(Data **)((long)&local_1c0.d.d + uVar27);
                pQStack_50[(long)local_48].d.d = pDVar1;
                pQStack_50[(long)local_48].d.ptr = *(char16_t **)((long)&local_1c0.d.ptr + uVar27);
                pQStack_50[(long)local_48].d.size = *(qsizetype *)((long)&local_1c0.d.size + uVar27)
                ;
                if (pDVar1 != (Data *)0x0) {
                  LOCK();
                  (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                local_48 = local_48 + 1;
                bVar12 = 0xffffffffffffffe7 < uVar27;
                uVar27 = uVar27 + 0x18;
              } while (bVar12);
              lVar15 = 0x18;
              do {
                piVar2 = *(int **)(local_1d8 + lVar15);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    QArrayData::deallocate(*(QArrayData **)(local_1d8 + lVar15),2,0x10);
                  }
                }
                lVar15 = lVar15 + -0x18;
              } while (lVar15 != -0x18);
              std::optional<QProcess>::emplace<>(&g_options.stdoutLogger);
              if (g_options.stdoutLogger.super__Optional_base<QProcess,_false,_false>._M_payload.
                  super__Optional_payload<QProcess,_true,_false,_false>.
                  super__Optional_payload_base<QProcess>._M_engaged == false) {
                main_cold_8();
LAB_0010b67f:
                main_cold_9();
              }
              else {
                QProcess::setProcessChannelMode(0x1161a8);
                if (g_options.stdoutLogger.super__Optional_base<QProcess,_false,_false>._M_payload.
                    super__Optional_payload<QProcess,_true,_false,_false>.
                    super__Optional_payload_base<QProcess>._M_engaged == false) goto LAB_0010b67f;
                QProcess::start(0x1161a8,0x116090,local_58,3);
                if (g_options.stdoutLogger.super__Optional_base<QProcess,_false,_false>._M_payload.
                    super__Optional_payload<QProcess,_true,_false,_false>.
                    super__Optional_payload_base<QProcess>._M_engaged != false) {
                  cVar13 = QProcess::waitForStarted(0x1161a8);
                  if (cVar13 == '\0') {
                    main_cold_11();
                  }
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_58);
                  if ((QArrayData *)local_78.a != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>._M_i
                         = (((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)&(local_78.a)->d)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_78.a,2,0x10);
                    }
                  }
                  if (cVar13 != '\0') {
                    waitForFinished();
                    bVar12 = stopStdoutLogger();
                    if (bVar12) {
                      iVar31 = testExitCode();
                      local_1d8[0] = SUB41(iVar31,0);
                      local_1d8[1] = (undefined1)((uint)iVar31 >> 8);
                      local_1d8._2_2_ = (undefined2)((uint)iVar31 >> 0x10);
                      analyseLogcat(&local_208,(int *)local_1d8);
                      bVar12 = pullResults();
                      iVar31 = -1;
                      uVar26 = 0xffffffff;
                      if (bVar12) {
                        uVar26 = CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0]));
                      }
                      local_1d8[0] = SUB41(uVar26,0);
                      local_1d8[1] = (undefined1)((uint)uVar26 >> 8);
                      local_1d8._2_2_ = (undefined2)((uint)uVar26 >> 0x10);
                      bVar12 = uninstallTestPackage();
                      if (bVar12) {
                        TestRunnerSystemSemaphore::release(&testRunnerLock);
                        if (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) == 0) {
                          iVar31 = CONCAT22(local_1d8._2_2_,CONCAT11(local_1d8[1],local_1d8[0]));
                        }
                        else {
                          main_cold_12();
                        }
                      }
                    }
                  }
                  goto LAB_0010b499;
                }
              }
              main_cold_10();
              goto LAB_0010b689;
            }
LAB_0010b499:
            if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
LAB_0010b4c2:
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_318);
    }
    else {
      main_cold_1();
LAB_0010b4f4:
      iVar31 = -1;
    }
    if (&(local_2f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2f8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    main_cold_15();
LAB_0010b4d9:
    iVar31 = -1;
  }
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_2d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar31;
  }
LAB_0010b689:
  __stack_chk_fail();
}

Assistant:

int main(int argc, char *argv[])
{
    std::signal(SIGINT,  sigHandler);
    std::signal(SIGTERM, sigHandler);

    QCoreApplication a(argc, argv);
    if (!parseOptions()) {
        printHelp();
        return EXIT_ERROR;
    }

    if (g_options.makeCommand.isEmpty()) {
        qCritical() << "It is required to provide a make command with the \"--make\" parameter "
                       "to generate the apk.";
        return EXIT_ERROR;
    }

    QByteArray buildOutput;
    if (!execCommand(g_options.makeCommand, &buildOutput, true)) {
        qCritical("The APK build command \"%s\" failed\n\n%s",
            qPrintable(g_options.makeCommand), buildOutput.constData());
        return EXIT_ERROR;
    }

    if (!QFile::exists(g_options.apkPath)) {
        qCritical("No apk \"%s\" found after running the make command. "
                  "Check the provided path and the make command.",
                  qPrintable(g_options.apkPath));
        return EXIT_ERROR;
    }

    const QStringList devices = runningDevices();
    if (devices.isEmpty()) {
        qCritical("No connected devices or running emulators can be found.");
        return EXIT_ERROR;
    } else if (!g_options.serial.isEmpty() && !devices.contains(g_options.serial)) {
        qCritical("No connected device or running emulator with serial '%s' can be found.",
                  qPrintable(g_options.serial));
        return EXIT_ERROR;
    }

    obtainSdkVersion();

    g_testInfo.userId = userId();

    if (!QFile::exists(g_options.manifestPath)) {
        qCritical("Unable to find '%s'.", qPrintable(g_options.manifestPath));
        return EXIT_ERROR;
    }
    g_options.package = packageNameFromAndroidManifest(g_options.manifestPath);
    if (g_options.activity.isEmpty())
        g_options.activity = activityFromAndroidManifest(g_options.manifestPath);

    // parseTestArgs depends on g_options.package
    if (!parseTestArgs())
        return EXIT_ERROR;

    // do not install or run packages while another test is running
    testRunnerLock.acquire();

    const QStringList installArgs = { "install"_L1, "-r"_L1, "-g"_L1, g_options.apkPath };
    g_testInfo.isPackageInstalled.store(execAdbCommand(installArgs, nullptr));
    if (!g_testInfo.isPackageInstalled)
        return EXIT_ERROR;

    // Call additional adb command if set after installation and before starting the test
    for (const auto &command : g_options.preTestRunAdbCommands) {
        QByteArray output;
        if (!execAdbCommand(command, &output)) {
            qCritical("The pre test ADB command \"%s\" failed with output:\n%s",
                  qUtf8Printable(command.join(u' ')), output.constData());
            return EXIT_ERROR;
        }
    }

    // Pre test start
    const QString formattedStartTime = getCurrentTimeString();

    // Start the test
    if (!execAdbCommand(g_options.amStarttestArgs, nullptr))
        return EXIT_ERROR;

    waitForStarted();
    waitForLoggingStarted();

    if (!setupStdoutLogger())
        return EXIT_ERROR;

    waitForFinished();

    // Post test run
    if (!stopStdoutLogger())
        return EXIT_ERROR;

    int exitCode = testExitCode();

    analyseLogcat(formattedStartTime, &exitCode);

    exitCode = pullResults() ? exitCode : EXIT_ERROR;

    if (!uninstallTestPackage())
        return EXIT_ERROR;

    testRunnerLock.release();

    if (g_testInfo.isTestRunnerInterrupted.load()) {
        qCritical() << "The androidtestrunner was interrupted and the was test cleaned up.";
        return EXIT_ERROR;
    }

    return exitCode;
}